

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

int __thiscall Centaurus::Grammar<char>::get_machine_id(Grammar<char> *this,Identifier *id)

{
  int iVar1;
  mapped_type *this_00;
  Identifier *id_local;
  Grammar<char> *this_local;
  
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
            ::at(&this->m_networks,id);
  iVar1 = ATNMachine<char>::get_unique_id(this_00);
  return iVar1;
}

Assistant:

int get_machine_id(const Identifier& id) const
	{
		return m_networks.at(id).get_unique_id();
	}